

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O0

off_t ngx_parse_offset(ngx_str_t *line)

{
  u_char uVar1;
  off_t oVar2;
  size_t local_40;
  size_t len;
  off_t max;
  off_t scale;
  off_t offset;
  u_char unit;
  ngx_str_t *line_local;
  
  local_40 = line->len;
  if (local_40 == 0) {
    return -1;
  }
  uVar1 = line->data[local_40 - 1];
  if (uVar1 == 'G') {
LAB_0011edb6:
    local_40 = local_40 - 1;
    len = 0x1ffffffff;
    max = 0x40000000;
  }
  else {
    if (uVar1 == 'K') {
LAB_0011ed6e:
      local_40 = local_40 - 1;
      len = 0x1fffffffffffff;
      max = 0x400;
      goto LAB_0011edf0;
    }
    if (uVar1 != 'M') {
      if (uVar1 == 'g') goto LAB_0011edb6;
      if (uVar1 == 'k') goto LAB_0011ed6e;
      if (uVar1 != 'm') {
        len = 0x7fffffffffffffff;
        max = 1;
        goto LAB_0011edf0;
      }
    }
    local_40 = local_40 - 1;
    len = 0x7ffffffffff;
    max = 0x100000;
  }
LAB_0011edf0:
  oVar2 = ngx_atoof(line->data,local_40);
  if ((oVar2 == -1) || ((long)len < oVar2)) {
    line_local = (ngx_str_t *)0xffffffffffffffff;
  }
  else {
    line_local = (ngx_str_t *)(max * oVar2);
  }
  return (off_t)line_local;
}

Assistant:

off_t
ngx_parse_offset(ngx_str_t *line)
{
    u_char  unit;
    off_t   offset, scale, max;
    size_t  len;

    len = line->len;

    if (len == 0) {
        return NGX_ERROR;
    }

    unit = line->data[len - 1];

    switch (unit) {
    case 'K':
    case 'k':
        len--;
        max = NGX_MAX_OFF_T_VALUE / 1024;
        scale = 1024;
        break;

    case 'M':
    case 'm':
        len--;
        max = NGX_MAX_OFF_T_VALUE / (1024 * 1024);
        scale = 1024 * 1024;
        break;

    case 'G':
    case 'g':
        len--;
        max = NGX_MAX_OFF_T_VALUE / (1024 * 1024 * 1024);
        scale = 1024 * 1024 * 1024;
        break;

    default:
        max = NGX_MAX_OFF_T_VALUE;
        scale = 1;
    }

    offset = ngx_atoof(line->data, len);
    if (offset == NGX_ERROR || offset > max) {
        return NGX_ERROR;
    }

    offset *= scale;

    return offset;
}